

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O2

TEdge * __thiscall ClipperLib::ClipperBase::AddBoundsToLML(ClipperBase *this,TEdge *e)

{
  double dVar1;
  long lVar2;
  long64 lVar3;
  long lVar4;
  LocalMinima *newLm;
  TEdge *pTVar5;
  double dVar6;
  
  pTVar5 = (TEdge *)0x0;
  do {
    while( true ) {
      e->nextInLML = pTVar5;
      e = e->next;
      dVar1 = e->dx;
      dVar6 = ABS(dVar1 + 1e+40);
      if (1e-20 <= dVar6) break;
      if (e->next->ytop < e->ytop) {
        pTVar5 = e->prev;
        lVar4 = pTVar5->xbot;
        if (lVar4 < e->next->xbot) goto LAB_0058e783;
      }
      else {
        pTVar5 = e->prev;
        lVar4 = pTVar5->xbot;
      }
      lVar2 = e->xtop;
      if (lVar2 != lVar4) {
        e->xcurr = lVar2;
        e->xtop = e->xbot;
        e->xbot = lVar2;
      }
    }
    pTVar5 = e->prev;
  } while (e->ycurr != pTVar5->ycurr);
LAB_0058e783:
  newLm = (LocalMinima *)operator_new(0x20);
  newLm->next = (LocalMinima *)0x0;
  newLm->Y = pTVar5->ybot;
  if (1e-20 <= dVar6) {
    if (pTVar5->dx <= dVar1) {
      newLm->leftBound = e;
      newLm->rightBound = pTVar5;
      pTVar5 = e;
      goto LAB_0058e7ef;
    }
  }
  else if (e->xbot != pTVar5->xbot) {
    lVar3 = e->xtop;
    e->xcurr = lVar3;
    e->xtop = e->xbot;
    e->xbot = lVar3;
  }
  newLm->leftBound = pTVar5;
  newLm->rightBound = e;
LAB_0058e7ef:
  pTVar5->side = esLeft;
  newLm->rightBound->side = esRight;
  InsertLocalMinima(this,newLm);
  while( true ) {
    pTVar5 = e->next;
    if ((pTVar5->ytop == e->ytop) && (1e-20 <= ABS(pTVar5->dx + 1e+40))) break;
    e->nextInLML = pTVar5;
    e = pTVar5;
    if ((ABS(pTVar5->dx + 1e+40) < 1e-20) && (pTVar5->xbot != pTVar5->prev->xtop)) {
      lVar3 = pTVar5->xtop;
      pTVar5->xcurr = lVar3;
      pTVar5->xtop = pTVar5->xbot;
      pTVar5->xbot = lVar3;
    }
  }
  return pTVar5;
}

Assistant:

TEdge* ClipperBase::AddBoundsToLML(TEdge *e)
{
  //Starting at the top of one bound we progress to the bottom where there's
  //a local minima. We then go to the top of the next bound. These two bounds
  //form the left and right (or right and left) bounds of the local minima.
  e->nextInLML = 0;
  e = e->next;
  for (;;)
  {
    if (NEAR_EQUAL(e->dx, HORIZONTAL))
    {
      //nb: proceed through horizontals when approaching from their right,
      //    but break on horizontal minima if approaching from their left.
      //    This ensures 'local minima' are always on the left of horizontals.
      if (e->next->ytop < e->ytop && e->next->xbot > e->prev->xbot) break;
      if (e->xtop != e->prev->xbot) SwapX(*e);
      e->nextInLML = e->prev;
    }
    else if (e->ycurr == e->prev->ycurr) break;
    else e->nextInLML = e->prev;
    e = e->next;
  }

  //e and e.prev are now at a local minima ...
  LocalMinima* newLm = new LocalMinima;
  newLm->next = 0;
  newLm->Y = e->prev->ybot;

  if ( NEAR_EQUAL(e->dx, HORIZONTAL) ) //horizontal edges never start a left bound
  {
    if (e->xbot != e->prev->xbot) SwapX(*e);
    newLm->leftBound = e->prev;
    newLm->rightBound = e;
  } else if (e->dx < e->prev->dx)
  {
    newLm->leftBound = e->prev;
    newLm->rightBound = e;
  } else
  {
    newLm->leftBound = e;
    newLm->rightBound = e->prev;
  }
  newLm->leftBound->side = esLeft;
  newLm->rightBound->side = esRight;
  InsertLocalMinima( newLm );

  for (;;)
  {
    if ( e->next->ytop == e->ytop && !NEAR_EQUAL(e->next->dx, HORIZONTAL) ) break;
    e->nextInLML = e->next;
    e = e->next;
    if ( NEAR_EQUAL(e->dx, HORIZONTAL) && e->xbot != e->prev->xtop) SwapX(*e);
  }
  return e->next;
}